

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O1

int cuddBddLICMarkEdges(DdManager *dd,DdNode *f,DdNode *c,st__table *table,st__table *cache)

{
  ulong uVar1;
  st__table *cache_00;
  int iVar2;
  uint uVar3;
  DdNode *pDVar4;
  uint *puVar5;
  undefined4 extraout_var;
  DdNode *f_00;
  char *__ptr;
  DdNode *c_00;
  int res;
  char **slot;
  uint local_64;
  char *local_60;
  undefined8 local_58;
  uint local_50;
  uint local_4c;
  st__table *local_48;
  char **local_40;
  DdNode *local_38;
  
  pDVar4 = (DdNode *)((ulong)dd->one ^ 1);
  if (pDVar4 == c) {
    return 0;
  }
  if (dd->one == f) {
    return 1;
  }
  if (pDVar4 == f) {
    return 2;
  }
  local_60 = (char *)malloc(0x10);
  if (local_60 == (char *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    return -1;
  }
  pDVar4 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  *(DdNode **)local_60 = pDVar4;
  *(DdNode **)(local_60 + 8) = c;
  local_48 = cache;
  iVar2 = st__lookup_int(cache,local_60,(int *)&local_64);
  cache_00 = local_48;
  if (iVar2 == 0) {
    local_4c = dd->perm[pDVar4->index];
    puVar5 = (uint *)((ulong)c & 0xfffffffffffffffe);
    local_50 = 0x7fffffff;
    if ((ulong)*puVar5 != 0x7fffffff) {
      local_50 = dd->perm[*puVar5];
    }
    local_38 = pDVar4;
    f_00 = pDVar4;
    if (local_4c <= local_50) {
      f_00 = (pDVar4->type).kids.T;
      local_38 = (pDVar4->type).kids.E;
    }
    c_00 = c;
    if (local_50 <= local_4c) {
      uVar1 = (ulong)c & 1;
      c = *(DdNode **)(puVar5 + 4);
      c_00 = *(DdNode **)(puVar5 + 6);
      if (uVar1 != 0) {
        c = (DdNode *)((ulong)*(DdNode **)(puVar5 + 4) ^ 1);
        c_00 = (DdNode *)((ulong)*(DdNode **)(puVar5 + 6) ^ 1);
      }
    }
    iVar2 = cuddBddLICMarkEdges(dd,f_00,c,table,local_48);
    __ptr = local_60;
    if ((iVar2 != -1) &&
       (local_58 = CONCAT44(extraout_var,iVar2),
       uVar3 = cuddBddLICMarkEdges(dd,local_38,c_00,table,cache_00), __ptr = local_60,
       uVar3 != 0xffffffff)) {
      if (local_4c <= local_50) {
        iVar2 = st__find_or_add(table,(char *)pDVar4,&local_40);
        if (iVar2 == 1) {
          *local_40 = (char *)(long)(int)((int)local_58 * 4 | *(uint *)local_40 | uVar3);
        }
        else {
          __ptr = local_60;
          if (iVar2 != 0) goto LAB_0078024b;
          *local_40 = (char *)(long)(int)((int)local_58 * 4 | uVar3);
        }
      }
      __ptr = local_60;
      local_64 = uVar3 | (uint)local_58;
      iVar2 = st__insert(local_48,local_60,(char *)(long)(int)local_64);
      if (iVar2 != -10000) goto LAB_00780101;
    }
LAB_0078024b:
    free(__ptr);
    return -1;
  }
  free(local_60);
LAB_00780101:
  if (((ulong)f & 1) == 0) {
    return local_64;
  }
  if (local_64 == 1) {
    return 2;
  }
  if (local_64 == 2) {
    return 1;
  }
  return local_64;
}

Assistant:

static int
cuddBddLICMarkEdges(
  DdManager * dd,
  DdNode * f,
  DdNode * c,
  st__table * table,
  st__table * cache)
{
    DdNode *Fv, *Fnv, *Cv, *Cnv;
    DdNode *one, *zero;
    unsigned int topf, topc;
    int comple;
    int resT, resE, res, retval;
    char **slot;
    MarkCacheKey *key;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (c == zero) return(DD_LIC_DC);
    if (f == one)  return(DD_LIC_1);
    if (f == zero) return(DD_LIC_0);

    /* Make canonical to increase the utilization of the cache. */
    comple = Cudd_IsComplement(f);
    f = Cudd_Regular(f);
    /* Now f is a regular pointer to a non-constant node; c may be
    ** constant, or it may be complemented.
    */

    /* Check the cache. */
    key = ABC_ALLOC(MarkCacheKey, 1);
    if (key == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(CUDD_OUT_OF_MEM);
    }
    key->f = f; key->c = c;
    if ( st__lookup_int(cache, (char *)key, &res)) {
        ABC_FREE(key);
        if (comple) {
            if (res == DD_LIC_0) res = DD_LIC_1;
            else if (res == DD_LIC_1) res = DD_LIC_0;
        }
        return(res);
    }

    /* Recursive step. */
    topf = dd->perm[f->index];
    topc = cuddI(dd,Cudd_Regular(c)->index);
    if (topf <= topc) {
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }
    if (topc <= topf) {
        /* We know that c is not constant because f is not. */
        Cv = cuddT(Cudd_Regular(c)); Cnv = cuddE(Cudd_Regular(c));
        if (Cudd_IsComplement(c)) {
            Cv = Cudd_Not(Cv);
            Cnv = Cudd_Not(Cnv);
        }
    } else {
        Cv = Cnv = c;
    }

    resT = cuddBddLICMarkEdges(dd, Fv, Cv, table, cache);
    if (resT == CUDD_OUT_OF_MEM) {
        ABC_FREE(key);
        return(CUDD_OUT_OF_MEM);
    }
    resE = cuddBddLICMarkEdges(dd, Fnv, Cnv, table, cache);
    if (resE == CUDD_OUT_OF_MEM) {
        ABC_FREE(key);
        return(CUDD_OUT_OF_MEM);
    }

    /* Update edge markings. */
    if (topf <= topc) {
        retval = st__find_or_add(table, (char *)f, (char ***)&slot);
        if (retval == 0) {
            *slot = (char *) (ptrint)((resT << 2) | resE);
        } else if (retval == 1) {
            *slot = (char *) (ptrint)((int)((ptrint) *slot) | (resT << 2) | resE);
        } else {
            ABC_FREE(key);
            return(CUDD_OUT_OF_MEM);
        }
    }

    /* Cache result. */
    res = resT | resE;
    if ( st__insert(cache, (char *)key, (char *)(ptrint)res) == st__OUT_OF_MEM) {
        ABC_FREE(key);
        return(CUDD_OUT_OF_MEM);
    }

    /* Take into account possible complementation. */
    if (comple) {
        if (res == DD_LIC_0) res = DD_LIC_1;
        else if (res == DD_LIC_1) res = DD_LIC_0;
    }
    return(res);

}